

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QColorListView.cpp
# Opt level: O2

void __thiscall QColorListViewPrivate::~QColorListViewPrivate(QColorListViewPrivate *this)

{
  QObject::~QObject(&this->super_QObject);
  operator_delete(this,0x20);
  return;
}

Assistant:

class QColorListViewPrivate : public QObject {
    Q_OBJECT

public:
    explicit QColorListViewPrivate(QColorListView *widgetP)
        : QObject(widgetP)
        , widget(widgetP)
        , model(new QColorListModel(this)) {
        Q_ASSERT(widget);

        widget->setEditTriggers(QAbstractItemView::NoEditTriggers);
        widget->setModel(model);
    }

    QString internalColorName(const QColor &color) const {
        return color.name(QColor::HexArgb);
    }